

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

int uint32_log2(uint32_t x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (x != 0) {
    uVar1 = (uint)(0xffff < x) << 4;
    uVar2 = x >> (sbyte)uVar1;
    uVar3 = uVar2 >> (0xff < uVar2) * '\b';
    uVar4 = uVar3 >> (0xf < uVar3) * '\x04';
    return (1 < uVar4 >> (3 < uVar4) * '\x02' | uVar1) + (uint)(0xff < uVar2) * 8 +
           (uint)(0xf < uVar3) * 4 + (uint)(3 < uVar4) * 2;
  }
  return -0x80000000;
}

Assistant:

int uint32_log2( uint32_t x )
{
    int a0, a1, a2, a3, a4;
    if (x == 0) return INT_MIN;
    a4 = (x > 0xffff)?16:0;
    x >>= a4;
    a3 = (x > 0xff)?8:0;
    x >>= a3;
    a2 = (x > 0xf)?4:0;
    x >>= a2;
    a1 = (x > 0x3)?2:0;
    x >>= a1;
    a0 = (x > 0x1)?1:0;
    return a0 + a1 + a2 + a3 + a4;
}